

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::Postprocess_BuildMaterial
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,aiMaterial **pMaterial)

{
  int iVar1;
  _List_node_base *p_Var2;
  undefined1 *__src;
  aiMaterial *this_00;
  runtime_error *prVar3;
  char *pKey;
  uint pSizeInBytes;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  aiString *pInput;
  uint type;
  size_t __n;
  float tvalf;
  aiColor3D tcol3;
  allocator<char> local_461;
  _List_node_base *local_460;
  undefined1 local_458 [32];
  aiString local_438;
  
  if (pMaterial == (aiMaterial **)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_438._0_8_ = local_438.data + 0xc;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_438,"Postprocess_BuildMaterial. pMaterial is nullptr.","");
    std::runtime_error::runtime_error(prVar3,(string *)&local_438);
    *(undefined ***)prVar3 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*pMaterial != (aiMaterial *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_438._0_8_ = local_438.data + 0xc;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_438,"Postprocess_BuildMaterial. *pMaterial must be nullptr.","");
    std::runtime_error::runtime_error(prVar3,(string *)&local_438);
    *(undefined ***)prVar3 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  *pMaterial = this_00;
  p_Var5 = (pNodeElement->Child).
           super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  p_Var4 = (_List_node_base *)&pNodeElement->Child;
  if (p_Var5 != p_Var4) {
    local_460 = p_Var4;
    do {
      p_Var2 = p_Var5[1]._M_next;
      iVar1 = *(int *)&p_Var2->_M_prev;
      if (iVar1 == 0x28) {
        p_Var2 = p_Var5[1]._M_next;
        local_438.data._0_4_ =
             *(float *)((long)(p_Var2 + 6) + 8) - *(float *)((long)(p_Var2 + 5) + 4);
        local_438.length =
             (ai_uint32)(*(float *)((long)(p_Var2 + 6) + 4) - *(float *)&p_Var2[5]._M_next);
        local_438.data._4_8_ = *(undefined8 *)((long)(p_Var2 + 5) + 0xc);
        local_438.data._12_4_ = *(undefined4 *)((long)(p_Var2 + 5) + 8);
        pSizeInBytes = 0x14;
        pKey = "$tex.uvtrafo";
        type = 1;
        pInput = &local_438;
LAB_0064b140:
        aiMaterial::AddBinaryProperty(this_00,pInput,pSizeInBytes,pKey,type,0,aiPTI_Float);
      }
      else if (iVar1 == 0x27) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_458,(char *)*(_List_node_base **)((long)(p_Var2 + 5) + 8),
                   &local_461);
        __src = (undefined1 *)CONCAT44(local_458._4_4_,local_458._0_4_);
        __n = local_458._8_8_ & 0xffffffff;
        if ((local_458._8_8_ & 0xfffffc00) != 0) {
          __n = 0x3ff;
        }
        local_438.length = (ai_uint32)__n;
        memcpy(local_438.data,__src,__n);
        local_438.data[__n] = '\0';
        if (__src != local_458 + 0x10) {
          operator_delete(__src,local_458._16_8_ + 1);
        }
        local_458._0_4_ = 0.0;
        aiMaterial::AddProperty(this_00,&local_438,"$tex.file",1,0);
        aiMaterial::AddBinaryProperty(this_00,p_Var2 + 5,1,"$tex.mapmodeu",1,0,aiPTI_Buffer);
        aiMaterial::AddBinaryProperty
                  (this_00,(void *)((long)(p_Var2 + 5) + 1),1,"$tex.mapmodev",1,0,aiPTI_Buffer);
        aiMaterial::AddBinaryProperty(this_00,local_458,4,"$tex.op",1,0,aiPTI_Integer);
        p_Var4 = local_460;
      }
      else if (iVar1 == 0x26) {
        local_438.data._0_4_ = *(undefined4 *)&p_Var2[5]._M_next;
        local_438.length = local_438.data._0_4_;
        local_438.data._8_4_ = local_438.data._8_4_;
        local_438.data._4_4_ = local_438.data._0_4_;
        aiMaterial::AddBinaryProperty(this_00,&local_438,0xc,"$clr.ambient",0,0,aiPTI_Float);
        aiMaterial::AddBinaryProperty
                  (this_00,(void *)((long)(p_Var2 + 5) + 4),0xc,"$clr.diffuse",0,0,aiPTI_Float);
        aiMaterial::AddBinaryProperty(this_00,p_Var2 + 6,0xc,"$clr.emissive",0,0,aiPTI_Float);
        aiMaterial::AddBinaryProperty(this_00,p_Var2 + 7,0xc,"$clr.specular",0,0,aiPTI_Float);
        local_458._0_4_ = 0x3f800000;
        aiMaterial::AddBinaryProperty
                  (this_00,(aiString *)local_458,4,"$mat.shinpercent",0,0,aiPTI_Float);
        aiMaterial::AddBinaryProperty
                  (this_00,(void *)((long)(p_Var2 + 6) + 0xc),4,"$mat.shininess",0,0,aiPTI_Float);
        local_458._0_4_ = 1.0 - *(float *)((long)(p_Var2 + 7) + 0xc);
        pSizeInBytes = 4;
        pKey = "$mat.opacity";
        type = 0;
        p_Var4 = local_460;
        pInput = (aiString *)local_458;
        goto LAB_0064b140;
      }
      p_Var5 = p_Var5->_M_next;
    } while (p_Var5 != p_Var4);
  }
  return;
}

Assistant:

void X3DImporter::Postprocess_BuildMaterial(const CX3DImporter_NodeElement& pNodeElement, aiMaterial** pMaterial) const
{
	// check argument
	if(pMaterial == nullptr) throw DeadlyImportError("Postprocess_BuildMaterial. pMaterial is nullptr.");
	if(*pMaterial != nullptr) throw DeadlyImportError("Postprocess_BuildMaterial. *pMaterial must be nullptr.");

	*pMaterial = new aiMaterial;
	aiMaterial& taimat = **pMaterial;// creating alias for convenience.

	// at this point pNodeElement point to <Appearance> node. Walk through childs and add all stored data.
	for(std::list<CX3DImporter_NodeElement*>::const_iterator el_it = pNodeElement.Child.begin(); el_it != pNodeElement.Child.end(); ++el_it)
	{
		if((*el_it)->Type == CX3DImporter_NodeElement::ENET_Material)
		{
			aiColor3D tcol3;
			float tvalf;
			CX3DImporter_NodeElement_Material& tnemat = *((CX3DImporter_NodeElement_Material*)*el_it);

			tcol3.r = tnemat.AmbientIntensity, tcol3.g = tnemat.AmbientIntensity, tcol3.b = tnemat.AmbientIntensity;
			taimat.AddProperty(&tcol3, 1, AI_MATKEY_COLOR_AMBIENT);
			taimat.AddProperty(&tnemat.DiffuseColor, 1, AI_MATKEY_COLOR_DIFFUSE);
			taimat.AddProperty(&tnemat.EmissiveColor, 1, AI_MATKEY_COLOR_EMISSIVE);
			taimat.AddProperty(&tnemat.SpecularColor, 1, AI_MATKEY_COLOR_SPECULAR);
			tvalf = 1;
			taimat.AddProperty(&tvalf, 1, AI_MATKEY_SHININESS_STRENGTH);
			taimat.AddProperty(&tnemat.Shininess, 1, AI_MATKEY_SHININESS);
			tvalf = 1.0f - tnemat.Transparency;
			taimat.AddProperty(&tvalf, 1, AI_MATKEY_OPACITY);
		}// if((*el_it)->Type == CX3DImporter_NodeElement::ENET_Material)
		else if((*el_it)->Type == CX3DImporter_NodeElement::ENET_ImageTexture)
		{
			CX3DImporter_NodeElement_ImageTexture& tnetex = *((CX3DImporter_NodeElement_ImageTexture*)*el_it);
			aiString url_str(tnetex.URL.c_str());
			int mode = aiTextureOp_Multiply;

			taimat.AddProperty(&url_str, AI_MATKEY_TEXTURE_DIFFUSE(0));
			taimat.AddProperty(&tnetex.RepeatS, 1, AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0));
			taimat.AddProperty(&tnetex.RepeatT, 1, AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0));
			taimat.AddProperty(&mode, 1, AI_MATKEY_TEXOP_DIFFUSE(0));
		}// else if((*el_it)->Type == CX3DImporter_NodeElement::ENET_ImageTexture)
		else if((*el_it)->Type == CX3DImporter_NodeElement::ENET_TextureTransform)
		{
			aiUVTransform trans;
			CX3DImporter_NodeElement_TextureTransform& tnetextr = *((CX3DImporter_NodeElement_TextureTransform*)*el_it);

			trans.mTranslation = tnetextr.Translation - tnetextr.Center;
			trans.mScaling = tnetextr.Scale;
			trans.mRotation = tnetextr.Rotation;
			taimat.AddProperty(&trans, 1, AI_MATKEY_UVTRANSFORM_DIFFUSE(0));
		}// else if((*el_it)->Type == CX3DImporter_NodeElement::ENET_TextureTransform)
	}// for(std::list<CX3DImporter_NodeElement*>::const_iterator el_it = pNodeElement.Child.begin(); el_it != pNodeElement.Child.end(); el_it++)
}